

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O3

XmlRpcValue __thiscall miniros::Publication::getStats(Publication *this)

{
  long lVar1;
  Publication *pPVar2;
  int iVar3;
  XmlRpcValue *pXVar4;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  string *in_RSI;
  long *plVar5;
  XmlRpcValue XVar6;
  XmlRpcValue conn_data;
  int local_54;
  pthread_mutex_t *local_50;
  Publication *local_48;
  XmlRpcValue local_40;
  
  *(undefined4 *)&(this->name_)._M_dataplus._M_p = 0;
  (this->name_)._M_string_length = 0;
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_40,in_RSI);
  pXVar4 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,0);
  XmlRpc::XmlRpcValue::operator=(pXVar4,&local_40);
  XmlRpc::XmlRpcValue::invalidate(&local_40);
  local_40._type = TypeInvalid;
  local_40._value.asDouble = 0.0;
  XmlRpc::XmlRpcValue::assertArray(&local_40,0);
  local_50 = (pthread_mutex_t *)&in_RSI[8].field_2;
  local_48 = this;
  iVar3 = pthread_mutex_lock(local_50);
  if (iVar3 == 0) {
    plVar5 = *(long **)((long)&in_RSI[7].field_2 + 8);
    if (plVar5 != (long *)in_RSI[8]._M_dataplus._M_p) {
      iVar3 = 0;
      do {
        lVar1 = *plVar5;
        local_54 = *(int *)(lVar1 + 0x28);
        pXVar4 = XmlRpc::XmlRpcValue::operator[](&local_40,iVar3);
        pXVar4 = XmlRpc::XmlRpcValue::operator[](pXVar4,0);
        XmlRpc::XmlRpcValue::operator=(pXVar4,&local_54);
        local_54 = *(int *)(lVar1 + 0x50);
        pXVar4 = XmlRpc::XmlRpcValue::operator[](&local_40,iVar3);
        pXVar4 = XmlRpc::XmlRpcValue::operator[](pXVar4,1);
        XmlRpc::XmlRpcValue::operator=(pXVar4,&local_54);
        local_54 = *(int *)(lVar1 + 0x58);
        pXVar4 = XmlRpc::XmlRpcValue::operator[](&local_40,iVar3);
        pXVar4 = XmlRpc::XmlRpcValue::operator[](pXVar4,2);
        XmlRpc::XmlRpcValue::operator=(pXVar4,&local_54);
        local_54 = *(int *)(lVar1 + 0x60);
        pXVar4 = XmlRpc::XmlRpcValue::operator[](&local_40,iVar3);
        pXVar4 = XmlRpc::XmlRpcValue::operator[](pXVar4,3);
        XmlRpc::XmlRpcValue::operator=(pXVar4,&local_54);
        local_54 = 0;
        pXVar4 = XmlRpc::XmlRpcValue::operator[](&local_40,iVar3);
        pXVar4 = XmlRpc::XmlRpcValue::operator[](pXVar4,4);
        XmlRpc::XmlRpcValue::operator=(pXVar4,&local_54);
        plVar5 = plVar5 + 2;
        iVar3 = iVar3 + 1;
      } while (plVar5 != (long *)in_RSI[8]._M_dataplus._M_p);
    }
    pPVar2 = local_48;
    pXVar4 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)local_48,1);
    XmlRpc::XmlRpcValue::operator=(pXVar4,&local_40);
    pthread_mutex_unlock(local_50);
    XmlRpc::XmlRpcValue::invalidate(&local_40);
    XVar6._value.asDouble = extraout_RDX.asDouble;
    XVar6._0_8_ = pPVar2;
    return XVar6;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

XmlRpc::XmlRpcValue Publication::getStats()
{
  XmlRpc::XmlRpcValue stats;
  stats[0] = name_;
  XmlRpc::XmlRpcValue conn_data;
  conn_data.setSize(0); // force to be an array, even if it's empty

  std::scoped_lock<std::mutex> lock(subscriber_links_mutex_);

  uint32_t cidx = 0;
  for (V_SubscriberLink::iterator c = subscriber_links_.begin();
       c != subscriber_links_.end(); ++c, cidx++)
  {
    const SubscriberLink::Stats& s = (*c)->getStats();
    conn_data[cidx][0] = (*c)->getConnectionID();
    // todo: figure out what to do here... the bytes_sent will wrap around
    // on some flows within a reasonable amount of time. xmlrpc++ doesn't
    // seem to give me a nice way to do 64-bit ints, perhaps that's a
    // limitation of xml-rpc, not sure. alternatively we could send the number
    // of KB transmitted to gain a few order of magnitude.
    conn_data[cidx][1] = (int)s.bytes_sent_;
    conn_data[cidx][2] = (int)s.message_data_sent_;
    conn_data[cidx][3] = (int)s.messages_sent_;
    conn_data[cidx][4] = 0; // not sure what is meant by connected
  }

  stats[1] = conn_data;
  return stats;
}